

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_value_scanner.cpp
# Opt level: O3

bool __thiscall duckdb::LineError::HandleErrors(LineError *this,StringValueResult *result)

{
  FullLinePosition *this_00;
  unordered_map<unsigned_long,_duckdb::shared_ptr<duckdb::CSVBufferHandle,_true>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::CSVBufferHandle,_true>_>_>_>
  *buffer_handles;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  *this_01;
  shared_ptr<duckdb::CSVFileScan,_true> *this_02;
  pointer pCVar1;
  idx_t iVar2;
  idx_t iVar3;
  CSVReaderOptions *pCVar4;
  idx_t iVar5;
  LinesPerBoundary error_info;
  LinesPerBoundary error_info_00;
  byte bVar6;
  bool bVar7;
  CSVFileScan *pCVar8;
  reference this_03;
  idx_t iVar9;
  idx_t iVar10;
  InvalidInputException *this_04;
  CurrentError *cur_error;
  pointer pCVar11;
  ulong uVar12;
  CSVReaderOptions *pCVar13;
  _Alloc_hider _Var14;
  idx_t iVar15;
  pointer pCVar16;
  LinesPerBoundary error_info_01;
  LinesPerBoundary error_info_02;
  LinesPerBoundary error_info_03;
  LinesPerBoundary error_info_04;
  LinesPerBoundary error_info_05;
  LinesPerBoundary error_info_06;
  LinesPerBoundary error_info_07;
  LinesPerBoundary error_info_08;
  LinesPerBoundary error_info_09;
  optional_idx in_stack_fffffffffffffd78;
  undefined4 uVar17;
  string *psVar18;
  string *psVar19;
  undefined7 uStack_278;
  bool first_nl;
  CSVReaderOptions *local_270;
  pointer local_268;
  undefined8 local_260;
  optional_idx local_258;
  LinesPerBoundary lines_per_batch;
  undefined1 local_238 [32];
  _Alloc_hider local_218;
  char local_208 [24];
  idx_t iStack_1f0;
  _Alloc_hider local_1e8;
  char local_1d8 [16];
  idx_t local_1c8;
  idx_t iStack_1c0;
  idx_t local_1b8;
  optional_idx oStack_1b0;
  StringValueResult *local_1a8;
  string borked_line;
  string column_name;
  CSVError csv_error;
  optional_idx local_a8;
  undefined1 local_a0 [16];
  optional_idx local_90;
  optional_idx local_88;
  optional_idx local_80;
  optional_idx local_78;
  optional_idx local_70;
  optional_idx local_68;
  optional_idx local_60;
  string *local_58;
  __node_base _Stack_50;
  string *local_48;
  idx_t iStack_40;
  
  pCVar1 = (this->current_errors).
           super_vector<duckdb::CurrentError,_std::allocator<duckdb::CurrentError>_>.
           super__Vector_base<duckdb::CurrentError,_std::allocator<duckdb::CurrentError>_>._M_impl.
           super__Vector_impl_data._M_finish;
  bVar6 = 0;
  pCVar16 = (this->current_errors).
            super_vector<duckdb::CurrentError,_std::allocator<duckdb::CurrentError>_>.
            super__Vector_base<duckdb::CurrentError,_std::allocator<duckdb::CurrentError>_>._M_impl.
            super__Vector_impl_data._M_start;
  for (pCVar11 = pCVar16; pCVar11 != pCVar1; pCVar11 = pCVar11 + 1) {
    bVar6 = bVar6 | pCVar11->type == INVALID_UNICODE;
  }
  if ((((this->ignore_errors == false) && ((bVar6 & result->sniffing) == 0)) ||
      (this->is_error_in_line != true)) || (result->figure_out_new_line != false)) {
    if (pCVar16 != pCVar1) {
      this_00 = &result->current_line_position;
      buffer_handles = &result->buffer_handles;
      local_258.index = (idx_t)&result->path;
      this_01 = &result->names;
      this_02 = &result->csv_file_scan;
      local_1a8 = result;
      do {
        uVar17 = (undefined4)(in_stack_fffffffffffffd78.index >> 0x20);
        LinesPerBoundary::LinesPerBoundary
                  (&lines_per_batch,(result->iterator->boundary).boundary_idx,*result->lines_read);
        first_nl = false;
        if ((result->super_ScannerResult).result_size == 1) {
          bVar6 = false;
        }
        else {
          pCVar13 = ((result->super_ScannerResult).state_machine)->options;
          bVar6 = true;
          if ((pCVar13->store_rejects).value == false) {
            bVar6 = (pCVar13->ignore_errors).value ^ 1;
          }
        }
        FullLinePosition::
        ReconstructCurrentLine<std::unordered_map<unsigned_long,duckdb::shared_ptr<duckdb::CSVBufferHandle,true>,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,duckdb::shared_ptr<duckdb::CSVBufferHandle,true>>>>>
                  (&borked_line,this_00,&first_nl,buffer_handles,(bool)bVar6);
        psVar18 = (string *)0xd01f37;
        CSVError::CSVError(&csv_error);
        iVar5 = lines_per_batch.lines_in_batch;
        iVar15 = lines_per_batch.boundary_idx;
        if (INVALID_STATE < pCVar16->type) {
switchD_00d01f58_caseD_1:
          this_04 = (InvalidInputException *)__cxa_allocate_exception(0x10);
          local_238._0_8_ = local_238 + 0x10;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_238,"CSV Error not allowed when inserting row","");
          InvalidInputException::InvalidInputException(this_04,(string *)local_238);
          __cxa_throw(this_04,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error)
          ;
        }
        pCVar13 = (CSVReaderOptions *)pCVar16->col_idx;
        switch(pCVar16->type) {
        case CAST_ERROR:
          column_name._M_dataplus._M_p = (pointer)&column_name.field_2;
          column_name._M_string_length = 0;
          column_name.field_2._M_local_buf[0] = '\0';
          if (pCVar13 < (CSVReaderOptions *)
                        ((long)(result->names).
                               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(result->names).
                               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 5)) {
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            ::operator[](this_01,(size_type)pCVar13);
            ::std::__cxx11::string::_M_assign((string *)&column_name);
            pCVar13 = (CSVReaderOptions *)pCVar16->col_idx;
          }
          if (pCVar13 < (CSVReaderOptions *)(ulong)result->number_of_columns) {
            local_260 = CONCAT44(local_260._4_4_,
                                 (int)CONCAT71((int7)(pCVar16->chunk_idx * 5 >> 8),
                                               *(LogicalTypeId *)
                                                ((long)((result->parse_types).
                                                                                                                
                                                  super_unique_ptr<duckdb::ParseTypeInfo[],_std::default_delete<duckdb::ParseTypeInfo[]>_>
                                                  ._M_t.
                                                  super___uniq_ptr_impl<duckdb::ParseTypeInfo,_std::default_delete<duckdb::ParseTypeInfo[]>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_duckdb::ParseTypeInfo_*,_std::default_delete<duckdb::ParseTypeInfo[]>_>
                                                  .
                                                  super__Head_base<0UL,_duckdb::ParseTypeInfo_*,_false>
                                                  ._M_head_impl + pCVar16->chunk_idx) + 1)));
          }
          else {
            local_260 = (ulong)local_260._4_4_ << 0x20;
          }
          iVar15 = (result->current_line_position).begin.buffer_pos;
          iVar5 = (result->current_line_position).begin.buffer_idx;
          iVar2 = (pCVar16->error_position).buffer_pos;
          iVar10 = (pCVar16->error_position).buffer_idx;
          if ((iVar10 == iVar5 && iVar15 == iVar2) &&
             (iVar10 = iVar5,
             (result->current_line_position).begin.buffer_size ==
             (pCVar16->error_position).buffer_size)) {
            pCVar4 = ((result->super_ScannerResult).state_machine)->options;
            local_48 = (string *)lines_per_batch.boundary_idx;
            iStack_40 = lines_per_batch.lines_in_batch;
            iVar15 = iVar15 + first_nl + result->requested_size * iVar5;
            local_270 = pCVar13;
            optional_idx::optional_idx(&local_90,iVar15);
            in_stack_fffffffffffffd78.index._4_4_ = uVar17;
            in_stack_fffffffffffffd78.index._0_4_ = (uint)(byte)local_260;
            error_info.lines_in_batch = iVar15;
            error_info.boundary_idx = iStack_40;
            CSVError::CastError((CSVError *)local_238,(CSVError *)pCVar4,
                                (CSVReaderOptions *)&column_name,&pCVar16->error_message,
                                (string *)local_270,(idx_t)&borked_line,local_48,error_info,
                                local_90.index,in_stack_fffffffffffffd78,
                                (LogicalTypeId)local_258.index,
                                (string *)CONCAT17(first_nl,uStack_278));
            ::std::__cxx11::string::operator=((string *)&csv_error,(string *)local_238);
            ::std::__cxx11::string::operator=
                      ((string *)&csv_error.full_error_message,(string *)&local_218);
            csv_error.type = local_208[0x10];
            csv_error._65_1_ = local_208[0x11];
            csv_error._66_1_ = local_208[0x12];
            csv_error._67_1_ = local_208[0x13];
            csv_error._68_1_ = local_208[0x14];
            csv_error._69_1_ = local_208[0x15];
            csv_error._70_1_ = local_208[0x16];
            csv_error._71_1_ = local_208[0x17];
            csv_error.column_idx = iStack_1f0;
            ::std::__cxx11::string::operator=((string *)&csv_error.csv_row,(string *)&local_1e8);
            csv_error.row_byte_position = local_1b8;
            csv_error.byte_position.index = oStack_1b0.index;
            csv_error.error_info.boundary_idx = local_1c8;
            csv_error.error_info.lines_in_batch = iStack_1c0;
            if (local_1e8._M_p != local_1d8) {
              operator_delete(local_1e8._M_p);
            }
            if (local_218._M_p != local_208) {
              operator_delete(local_218._M_p);
            }
            if ((undefined1 *)local_238._0_8_ != local_238 + 0x10) {
LAB_00d02e74:
              operator_delete((void *)local_238._0_8_);
            }
          }
          else {
            pCVar4 = ((result->super_ScannerResult).state_machine)->options;
            local_58 = (string *)lines_per_batch.boundary_idx;
            _Stack_50._M_nxt = (_Hash_node_base *)lines_per_batch.lines_in_batch;
            iVar3 = result->requested_size;
            uVar12 = (ulong)first_nl;
            local_268 = pCVar16;
            optional_idx::optional_idx((optional_idx *)(local_a0 + 8),iVar2 + iVar10 * iVar3);
            in_stack_fffffffffffffd78.index._4_4_ = uVar17;
            in_stack_fffffffffffffd78.index._0_4_ = (uint)(byte)local_260;
            error_info_00.lines_in_batch = iVar5 * iVar3 + iVar15 + uVar12;
            error_info_00.boundary_idx = (idx_t)_Stack_50._M_nxt;
            CSVError::CastError((CSVError *)local_238,(CSVError *)pCVar4,
                                (CSVReaderOptions *)&column_name,&local_268->error_message,
                                (string *)pCVar13,(idx_t)&borked_line,local_58,error_info_00,
                                local_a0._8_8_,in_stack_fffffffffffffd78,
                                (LogicalTypeId)local_258.index,
                                (string *)CONCAT17(first_nl,uStack_278));
            ::std::__cxx11::string::operator=((string *)&csv_error,(string *)local_238);
            ::std::__cxx11::string::operator=
                      ((string *)&csv_error.full_error_message,(string *)&local_218);
            csv_error.type = local_208[0x10];
            csv_error._65_1_ = local_208[0x11];
            csv_error._66_1_ = local_208[0x12];
            csv_error._67_1_ = local_208[0x13];
            csv_error._68_1_ = local_208[0x14];
            csv_error._69_1_ = local_208[0x15];
            csv_error._70_1_ = local_208[0x16];
            csv_error._71_1_ = local_208[0x17];
            csv_error.column_idx = iStack_1f0;
            ::std::__cxx11::string::operator=((string *)&csv_error.csv_row,(string *)&local_1e8);
            csv_error.row_byte_position = local_1b8;
            csv_error.byte_position.index = oStack_1b0.index;
            csv_error.error_info.boundary_idx = local_1c8;
            csv_error.error_info.lines_in_batch = iStack_1c0;
            if (local_1e8._M_p != local_1d8) {
              operator_delete(local_1e8._M_p);
            }
            result = local_1a8;
            pCVar16 = local_268;
            if (local_218._M_p != local_208) {
              operator_delete(local_218._M_p);
            }
            if ((undefined1 *)local_238._0_8_ != local_238 + 0x10) goto LAB_00d02e74;
          }
          _Var14._M_p = column_name._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)column_name._M_dataplus._M_p != &column_name.field_2) goto LAB_00d02e8e;
          break;
        default:
          goto switchD_00d01f58_caseD_1;
        case TOO_FEW_COLUMNS:
        case TOO_MANY_COLUMNS:
          iVar2 = (result->current_line_position).begin.buffer_pos;
          iVar10 = (result->current_line_position).begin.buffer_idx;
          iVar3 = (pCVar16->error_position).buffer_pos;
          iVar9 = (pCVar16->error_position).buffer_idx;
          if ((iVar9 == iVar10 && iVar2 == iVar3) &&
             (iVar9 = iVar10,
             (result->current_line_position).begin.buffer_size ==
             (pCVar16->error_position).buffer_size)) {
            pCVar4 = ((result->super_ScannerResult).state_machine)->options;
            psVar18 = (string *)(iVar2 + first_nl + result->requested_size * iVar10);
            psVar19 = (string *)0xd01fd8;
            local_270 = pCVar13;
            local_268 = pCVar16;
            optional_idx::optional_idx(&local_60,(idx_t)psVar18);
            error_info_02.lines_in_batch = (idx_t)&borked_line;
            error_info_02.boundary_idx = iVar5;
            in_stack_fffffffffffffd78.index = local_258.index;
            CSVError::IncorrectColumnAmountError
                      ((CSVError *)local_238,(CSVError *)pCVar4,local_270,iVar15,error_info_02,
                       psVar18,local_60.index,local_258,psVar19);
            ::std::__cxx11::string::operator=((string *)&csv_error,(string *)local_238);
            ::std::__cxx11::string::operator=
                      ((string *)&csv_error.full_error_message,(string *)&local_218);
            csv_error.type = local_208[0x10];
            csv_error._65_1_ = local_208[0x11];
            csv_error._66_1_ = local_208[0x12];
            csv_error._67_1_ = local_208[0x13];
            csv_error._68_1_ = local_208[0x14];
            csv_error._69_1_ = local_208[0x15];
            csv_error._70_1_ = local_208[0x16];
            csv_error._71_1_ = local_208[0x17];
            csv_error.column_idx = iStack_1f0;
            ::std::__cxx11::string::operator=((string *)&csv_error.csv_row,(string *)&local_1e8);
            csv_error.row_byte_position = local_1b8;
            csv_error.byte_position.index = oStack_1b0.index;
            csv_error.error_info.boundary_idx = local_1c8;
            csv_error.error_info.lines_in_batch = iStack_1c0;
            if (local_1e8._M_p != local_1d8) {
              operator_delete(local_1e8._M_p);
            }
            pCVar16 = local_268;
            if (local_218._M_p != local_208) {
              operator_delete(local_218._M_p);
            }
            _Var14._M_p = (pointer)local_238._0_8_;
            if ((undefined1 *)local_238._0_8_ != local_238 + 0x10) {
LAB_00d02e8e:
              operator_delete(_Var14._M_p);
            }
          }
          else {
            iVar15 = result->requested_size;
            pCVar4 = ((result->super_ScannerResult).state_machine)->options;
            local_260 = lines_per_batch.boundary_idx;
            uVar12 = (ulong)first_nl;
            psVar18 = (string *)0xd0269e;
            local_270 = pCVar13;
            local_268 = pCVar16;
            optional_idx::optional_idx(&local_68,iVar3 + iVar9 * iVar15);
            error_info_06.lines_in_batch = (idx_t)&borked_line;
            error_info_06.boundary_idx = iVar5;
            in_stack_fffffffffffffd78.index = local_258.index;
            CSVError::IncorrectColumnAmountError
                      ((CSVError *)local_238,(CSVError *)pCVar4,local_270,local_260,error_info_06,
                       (string *)(iVar10 * iVar15 + iVar2 + uVar12),local_68.index,local_258,psVar18
                      );
            ::std::__cxx11::string::operator=((string *)&csv_error,(string *)local_238);
            ::std::__cxx11::string::operator=
                      ((string *)&csv_error.full_error_message,(string *)&local_218);
            csv_error.type = local_208[0x10];
            csv_error._65_1_ = local_208[0x11];
            csv_error._66_1_ = local_208[0x12];
            csv_error._67_1_ = local_208[0x13];
            csv_error._68_1_ = local_208[0x14];
            csv_error._69_1_ = local_208[0x15];
            csv_error._70_1_ = local_208[0x16];
            csv_error._71_1_ = local_208[0x17];
            csv_error.column_idx = iStack_1f0;
            ::std::__cxx11::string::operator=((string *)&csv_error.csv_row,(string *)&local_1e8);
            csv_error.row_byte_position = local_1b8;
            csv_error.byte_position.index = oStack_1b0.index;
            csv_error.error_info.boundary_idx = local_1c8;
            csv_error.error_info.lines_in_batch = iStack_1c0;
            if (local_1e8._M_p != local_1d8) {
              operator_delete(local_1e8._M_p);
            }
            result = local_1a8;
            pCVar16 = local_268;
            if (local_218._M_p != local_208) {
              operator_delete(local_218._M_p);
            }
            _Var14._M_p = (pointer)local_238._0_8_;
            if ((undefined1 *)local_238._0_8_ != local_238 + 0x10) goto LAB_00d02e8e;
          }
          break;
        case UNTERMINATED_QUOTES:
          iVar2 = (result->current_line_position).begin.buffer_pos;
          iVar10 = (result->current_line_position).begin.buffer_idx;
          iVar3 = (pCVar16->error_position).buffer_pos;
          iVar9 = (pCVar16->error_position).buffer_idx;
          if ((iVar9 == iVar10 && iVar2 == iVar3) &&
             (iVar9 = iVar10,
             (result->current_line_position).begin.buffer_size ==
             (pCVar16->error_position).buffer_size)) {
            pCVar4 = ((result->super_ScannerResult).state_machine)->options;
            psVar18 = (string *)(iVar2 + first_nl + result->requested_size * iVar10);
            psVar19 = (string *)0xd0257e;
            local_270 = pCVar13;
            local_268 = pCVar16;
            optional_idx::optional_idx(&local_80,(idx_t)psVar18);
            error_info_05.lines_in_batch = (idx_t)&borked_line;
            error_info_05.boundary_idx = iVar5;
            in_stack_fffffffffffffd78.index = local_258.index;
            CSVError::UnterminatedQuotesError
                      ((CSVError *)local_238,(CSVError *)pCVar4,local_270,iVar15,error_info_05,
                       psVar18,local_80.index,local_258,psVar19);
            ::std::__cxx11::string::operator=((string *)&csv_error,(string *)local_238);
            ::std::__cxx11::string::operator=
                      ((string *)&csv_error.full_error_message,(string *)&local_218);
            csv_error.type = local_208[0x10];
            csv_error._65_1_ = local_208[0x11];
            csv_error._66_1_ = local_208[0x12];
            csv_error._67_1_ = local_208[0x13];
            csv_error._68_1_ = local_208[0x14];
            csv_error._69_1_ = local_208[0x15];
            csv_error._70_1_ = local_208[0x16];
            csv_error._71_1_ = local_208[0x17];
            csv_error.column_idx = iStack_1f0;
            ::std::__cxx11::string::operator=((string *)&csv_error.csv_row,(string *)&local_1e8);
            csv_error.row_byte_position = local_1b8;
            csv_error.byte_position.index = oStack_1b0.index;
            csv_error.error_info.boundary_idx = local_1c8;
            csv_error.error_info.lines_in_batch = iStack_1c0;
            if (local_1e8._M_p != local_1d8) {
              operator_delete(local_1e8._M_p);
            }
            pCVar16 = local_268;
            if (local_218._M_p != local_208) {
              operator_delete(local_218._M_p);
            }
            _Var14._M_p = (pointer)local_238._0_8_;
            if ((undefined1 *)local_238._0_8_ != local_238 + 0x10) goto LAB_00d02e8e;
          }
          else {
            iVar15 = result->requested_size;
            pCVar4 = ((result->super_ScannerResult).state_machine)->options;
            local_260 = lines_per_batch.boundary_idx;
            uVar12 = (ulong)first_nl;
            psVar18 = (string *)0xd02c20;
            local_270 = pCVar13;
            local_268 = pCVar16;
            optional_idx::optional_idx(&local_88,iVar3 + iVar9 * iVar15);
            error_info_09.lines_in_batch = (idx_t)&borked_line;
            error_info_09.boundary_idx = iVar5;
            in_stack_fffffffffffffd78.index = local_258.index;
            CSVError::UnterminatedQuotesError
                      ((CSVError *)local_238,(CSVError *)pCVar4,local_270,local_260,error_info_09,
                       (string *)(iVar10 * iVar15 + iVar2 + uVar12),local_88.index,local_258,psVar18
                      );
            ::std::__cxx11::string::operator=((string *)&csv_error,(string *)local_238);
            ::std::__cxx11::string::operator=
                      ((string *)&csv_error.full_error_message,(string *)&local_218);
            csv_error.type = local_208[0x10];
            csv_error._65_1_ = local_208[0x11];
            csv_error._66_1_ = local_208[0x12];
            csv_error._67_1_ = local_208[0x13];
            csv_error._68_1_ = local_208[0x14];
            csv_error._69_1_ = local_208[0x15];
            csv_error._70_1_ = local_208[0x16];
            csv_error._71_1_ = local_208[0x17];
            csv_error.column_idx = iStack_1f0;
            ::std::__cxx11::string::operator=((string *)&csv_error.csv_row,(string *)&local_1e8);
            csv_error.row_byte_position = local_1b8;
            csv_error.byte_position.index = oStack_1b0.index;
            csv_error.error_info.boundary_idx = local_1c8;
            csv_error.error_info.lines_in_batch = iStack_1c0;
            if (local_1e8._M_p != local_1d8) {
              operator_delete(local_1e8._M_p);
            }
            result = local_1a8;
            pCVar16 = local_268;
            if (local_218._M_p != local_208) {
              operator_delete(local_218._M_p);
            }
            _Var14._M_p = (pointer)local_238._0_8_;
            if ((undefined1 *)local_238._0_8_ != local_238 + 0x10) goto LAB_00d02e8e;
          }
          break;
        case MAXIMUM_LINE_SIZE:
          error_info_01.lines_in_batch = (idx_t)&borked_line;
          error_info_01.boundary_idx = lines_per_batch.lines_in_batch;
          in_stack_fffffffffffffd78.index = local_258.index;
          CSVError::LineSizeError
                    ((CSVError *)local_238,
                     (CSVError *)((result->super_ScannerResult).state_machine)->options,
                     (CSVReaderOptions *)lines_per_batch.boundary_idx,error_info_01,
                     (string *)
                     ((ulong)first_nl + (result->current_line_position).begin.buffer_pos +
                     (result->current_line_position).begin.buffer_idx * result->requested_size),
                     local_258.index,psVar18);
          ::std::__cxx11::string::operator=((string *)&csv_error,(string *)local_238);
          ::std::__cxx11::string::operator=
                    ((string *)&csv_error.full_error_message,(string *)&local_218);
          csv_error.type = local_208[0x10];
          csv_error._65_1_ = local_208[0x11];
          csv_error._66_1_ = local_208[0x12];
          csv_error._67_1_ = local_208[0x13];
          csv_error._68_1_ = local_208[0x14];
          csv_error._69_1_ = local_208[0x15];
          csv_error._70_1_ = local_208[0x16];
          csv_error._71_1_ = local_208[0x17];
          csv_error.column_idx = iStack_1f0;
          ::std::__cxx11::string::operator=((string *)&csv_error.csv_row,(string *)&local_1e8);
          csv_error.row_byte_position = local_1b8;
          csv_error.byte_position.index = oStack_1b0.index;
          csv_error.error_info.boundary_idx = local_1c8;
          csv_error.error_info.lines_in_batch = iStack_1c0;
          if (local_1e8._M_p != local_1d8) {
            operator_delete(local_1e8._M_p);
          }
          if (local_218._M_p != local_208) {
            operator_delete(local_218._M_p);
          }
          _Var14._M_p = (pointer)local_238._0_8_;
          if ((undefined1 *)local_238._0_8_ != local_238 + 0x10) goto LAB_00d02e8e;
          break;
        case INVALID_UNICODE:
          iVar2 = (result->current_line_position).begin.buffer_pos;
          iVar10 = (result->current_line_position).begin.buffer_idx;
          iVar3 = (pCVar16->error_position).buffer_pos;
          iVar9 = (pCVar16->error_position).buffer_idx;
          if ((iVar9 == iVar10 && iVar2 == iVar3) &&
             (iVar9 = iVar10,
             (result->current_line_position).begin.buffer_size ==
             (pCVar16->error_position).buffer_size)) {
            pCVar4 = ((result->super_ScannerResult).state_machine)->options;
            psVar18 = (string *)(iVar2 + first_nl + result->requested_size * iVar10);
            psVar19 = (string *)0xd0213b;
            local_270 = pCVar13;
            local_268 = pCVar16;
            optional_idx::optional_idx(&local_70,(idx_t)psVar18);
            error_info_03.lines_in_batch = (idx_t)&borked_line;
            error_info_03.boundary_idx = iVar5;
            in_stack_fffffffffffffd78.index = local_258.index;
            CSVError::InvalidUTF8
                      ((CSVError *)local_238,(CSVError *)pCVar4,local_270,iVar15,error_info_03,
                       psVar18,local_70.index,local_258,psVar19);
            ::std::__cxx11::string::operator=((string *)&csv_error,(string *)local_238);
            ::std::__cxx11::string::operator=
                      ((string *)&csv_error.full_error_message,(string *)&local_218);
            csv_error.type = local_208[0x10];
            csv_error._65_1_ = local_208[0x11];
            csv_error._66_1_ = local_208[0x12];
            csv_error._67_1_ = local_208[0x13];
            csv_error._68_1_ = local_208[0x14];
            csv_error._69_1_ = local_208[0x15];
            csv_error._70_1_ = local_208[0x16];
            csv_error._71_1_ = local_208[0x17];
            csv_error.column_idx = iStack_1f0;
            ::std::__cxx11::string::operator=((string *)&csv_error.csv_row,(string *)&local_1e8);
            csv_error.row_byte_position = local_1b8;
            csv_error.byte_position.index = oStack_1b0.index;
            csv_error.error_info.boundary_idx = local_1c8;
            csv_error.error_info.lines_in_batch = iStack_1c0;
            if (local_1e8._M_p != local_1d8) {
              operator_delete(local_1e8._M_p);
            }
            pCVar16 = local_268;
            pCVar13 = local_270;
            if (local_218._M_p != local_208) {
              operator_delete(local_218._M_p);
            }
            if ((undefined1 *)local_238._0_8_ != local_238 + 0x10) {
LAB_00d02a4e:
              operator_delete((void *)local_238._0_8_);
            }
          }
          else {
            iVar15 = result->requested_size;
            pCVar4 = ((result->super_ScannerResult).state_machine)->options;
            local_260 = lines_per_batch.boundary_idx;
            uVar12 = (ulong)first_nl;
            psVar18 = (string *)0xd0295a;
            local_270 = pCVar13;
            local_268 = pCVar16;
            optional_idx::optional_idx(&local_78,iVar3 + iVar9 * iVar15);
            error_info_07.lines_in_batch = (idx_t)&borked_line;
            error_info_07.boundary_idx = iVar5;
            in_stack_fffffffffffffd78.index = local_258.index;
            CSVError::InvalidUTF8
                      ((CSVError *)local_238,(CSVError *)pCVar4,local_270,local_260,error_info_07,
                       (string *)(iVar10 * iVar15 + iVar2 + uVar12),local_78.index,local_258,psVar18
                      );
            ::std::__cxx11::string::operator=((string *)&csv_error,(string *)local_238);
            ::std::__cxx11::string::operator=
                      ((string *)&csv_error.full_error_message,(string *)&local_218);
            csv_error.type = local_208[0x10];
            csv_error._65_1_ = local_208[0x11];
            csv_error._66_1_ = local_208[0x12];
            csv_error._67_1_ = local_208[0x13];
            csv_error._68_1_ = local_208[0x14];
            csv_error._69_1_ = local_208[0x15];
            csv_error._70_1_ = local_208[0x16];
            csv_error._71_1_ = local_208[0x17];
            csv_error.column_idx = iStack_1f0;
            ::std::__cxx11::string::operator=((string *)&csv_error.csv_row,(string *)&local_1e8);
            csv_error.row_byte_position = local_1b8;
            csv_error.byte_position.index = oStack_1b0.index;
            csv_error.error_info.boundary_idx = local_1c8;
            csv_error.error_info.lines_in_batch = iStack_1c0;
            if (local_1e8._M_p != local_1d8) {
              operator_delete(local_1e8._M_p);
            }
            result = local_1a8;
            pCVar16 = local_268;
            pCVar13 = local_270;
            if (local_218._M_p != local_208) {
              operator_delete(local_218._M_p);
            }
            if ((undefined1 *)local_238._0_8_ != local_238 + 0x10) goto LAB_00d02a4e;
          }
          pCVar8 = shared_ptr<duckdb::CSVFileScan,_true>::operator->(this_02);
          this_03 = vector<duckdb::LogicalType,_true>::operator[]
                              (&pCVar8->file_types,(size_type)pCVar13);
          uVar12 = (ulong)this_03->id_;
          if (0x20 < uVar12) goto LAB_00d02f30;
          if ((0xf0e9fc00UL >> (uVar12 & 0x3f) & 1) == 0) {
            if (uVar12 == 0x19) {
              bVar7 = LogicalType::IsJSONType(this_03);
              if (bVar7) goto LAB_00d02f30;
            }
            else if ((uVar12 != 0x20) || (result->icu_loaded == true)) {
LAB_00d02f30:
              result->number_of_rows = result->number_of_rows + -1;
            }
          }
          break;
        case INVALID_STATE:
          iVar2 = (result->current_line_position).begin.buffer_pos;
          iVar10 = (result->current_line_position).begin.buffer_idx;
          iVar3 = (pCVar16->error_position).buffer_pos;
          iVar9 = (pCVar16->error_position).buffer_idx;
          if ((iVar9 == iVar10 && iVar2 == iVar3) &&
             (iVar9 = iVar10,
             (result->current_line_position).begin.buffer_size ==
             (pCVar16->error_position).buffer_size)) {
            pCVar4 = ((result->super_ScannerResult).state_machine)->options;
            psVar18 = (string *)(iVar2 + first_nl + result->requested_size * iVar10);
            psVar19 = (string *)0xd0232e;
            local_270 = pCVar13;
            local_268 = pCVar16;
            optional_idx::optional_idx((optional_idx *)local_a0,(idx_t)psVar18);
            error_info_04.lines_in_batch = (idx_t)&borked_line;
            error_info_04.boundary_idx = iVar5;
            in_stack_fffffffffffffd78.index = local_258.index;
            CSVError::InvalidState
                      ((CSVError *)local_238,(CSVError *)pCVar4,local_270,iVar15,error_info_04,
                       psVar18,local_a0._0_8_,local_258,psVar19);
            ::std::__cxx11::string::operator=((string *)&csv_error,(string *)local_238);
            ::std::__cxx11::string::operator=
                      ((string *)&csv_error.full_error_message,(string *)&local_218);
            csv_error.type = local_208[0x10];
            csv_error._65_1_ = local_208[0x11];
            csv_error._66_1_ = local_208[0x12];
            csv_error._67_1_ = local_208[0x13];
            csv_error._68_1_ = local_208[0x14];
            csv_error._69_1_ = local_208[0x15];
            csv_error._70_1_ = local_208[0x16];
            csv_error._71_1_ = local_208[0x17];
            csv_error.column_idx = iStack_1f0;
            ::std::__cxx11::string::operator=((string *)&csv_error.csv_row,(string *)&local_1e8);
            csv_error.row_byte_position = local_1b8;
            csv_error.byte_position.index = oStack_1b0.index;
            csv_error.error_info.boundary_idx = local_1c8;
            csv_error.error_info.lines_in_batch = iStack_1c0;
            if (local_1e8._M_p != local_1d8) {
              operator_delete(local_1e8._M_p);
            }
            pCVar16 = local_268;
            if (local_218._M_p != local_208) {
              operator_delete(local_218._M_p);
            }
            _Var14._M_p = (pointer)local_238._0_8_;
            if ((undefined1 *)local_238._0_8_ != local_238 + 0x10) goto LAB_00d02e8e;
          }
          else {
            iVar15 = result->requested_size;
            pCVar4 = ((result->super_ScannerResult).state_machine)->options;
            local_260 = lines_per_batch.boundary_idx;
            uVar12 = (ulong)first_nl;
            psVar18 = (string *)0xd02aef;
            local_270 = pCVar13;
            local_268 = pCVar16;
            optional_idx::optional_idx(&local_a8,iVar3 + iVar9 * iVar15);
            error_info_08.lines_in_batch = (idx_t)&borked_line;
            error_info_08.boundary_idx = iVar5;
            in_stack_fffffffffffffd78.index = local_258.index;
            CSVError::InvalidState
                      ((CSVError *)local_238,(CSVError *)pCVar4,local_270,local_260,error_info_08,
                       (string *)(iVar10 * iVar15 + iVar2 + uVar12),local_a8.index,local_258,psVar18
                      );
            ::std::__cxx11::string::operator=((string *)&csv_error,(string *)local_238);
            ::std::__cxx11::string::operator=
                      ((string *)&csv_error.full_error_message,(string *)&local_218);
            csv_error.type = local_208[0x10];
            csv_error._65_1_ = local_208[0x11];
            csv_error._66_1_ = local_208[0x12];
            csv_error._67_1_ = local_208[0x13];
            csv_error._68_1_ = local_208[0x14];
            csv_error._69_1_ = local_208[0x15];
            csv_error._70_1_ = local_208[0x16];
            csv_error._71_1_ = local_208[0x17];
            csv_error.column_idx = iStack_1f0;
            ::std::__cxx11::string::operator=((string *)&csv_error.csv_row,(string *)&local_1e8);
            csv_error.row_byte_position = local_1b8;
            csv_error.byte_position.index = oStack_1b0.index;
            csv_error.error_info.boundary_idx = local_1c8;
            csv_error.error_info.lines_in_batch = iStack_1c0;
            if (local_1e8._M_p != local_1d8) {
              operator_delete(local_1e8._M_p);
            }
            result = local_1a8;
            pCVar16 = local_268;
            if (local_218._M_p != local_208) {
              operator_delete(local_218._M_p);
            }
            _Var14._M_p = (pointer)local_238._0_8_;
            if ((undefined1 *)local_238._0_8_ != local_238 + 0x10) goto LAB_00d02e8e;
          }
        }
        CSVErrorHandler::Error(result->error_handler,&csv_error,false);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)csv_error.csv_row._M_dataplus._M_p != &csv_error.csv_row.field_2) {
          operator_delete(csv_error.csv_row._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)csv_error.full_error_message._M_dataplus._M_p !=
            &csv_error.full_error_message.field_2) {
          operator_delete(csv_error.full_error_message._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)csv_error.error_message._M_dataplus._M_p != &csv_error.error_message.field_2) {
          operator_delete(csv_error.error_message._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)borked_line._M_dataplus._M_p != &borked_line.field_2) {
          operator_delete(borked_line._M_dataplus._M_p);
        }
        pCVar16 = pCVar16 + 1;
      } while (pCVar16 != pCVar1);
    }
    if (this->is_error_in_line != true) {
      return false;
    }
    if (this->scan_id == 0xffffffffffffffff) {
      return false;
    }
    if (result->sniffing == true) {
      StringValueResult::RemoveLastLine(result);
    }
    else {
      csv_error.error_message._M_dataplus._M_p = (pointer)&result->borked_rows;
      local_238._0_8_ = result->number_of_rows;
      ::std::
      _Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
      ::
      _M_insert<unsigned_long,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_long,false>>>>
                ();
      result->cur_col_id = 0;
      result->chunk_col_id = 0;
    }
  }
  else {
    StringValueResult::RemoveLastLine(result);
  }
  ::std::vector<duckdb::CurrentError,_std::allocator<duckdb::CurrentError>_>::clear
            ((vector<duckdb::CurrentError,_std::allocator<duckdb::CurrentError>_> *)this);
  this->is_error_in_line = false;
  return true;
}

Assistant:

bool LineError::HandleErrors(StringValueResult &result) {
	bool skip_sniffing = false;
	for (auto &cur_error : current_errors) {
		if (cur_error.type == CSVErrorType::INVALID_UNICODE) {
			skip_sniffing = true;
		}
	}
	skip_sniffing = result.sniffing && skip_sniffing;

	if ((ignore_errors || skip_sniffing) && is_error_in_line && !result.figure_out_new_line) {
		result.RemoveLastLine();
		Reset();
		return true;
	}
	// Reconstruct CSV Line
	for (auto &cur_error : current_errors) {
		LinesPerBoundary lines_per_batch(result.iterator.GetBoundaryIdx(), result.lines_read);
		bool first_nl = false;
		auto borked_line = result.current_line_position.ReconstructCurrentLine(first_nl, result.buffer_handles,
		                                                                       result.PrintErrorLine());
		CSVError csv_error;
		auto col_idx = cur_error.col_idx;
		auto &line_pos = cur_error.error_position;

		switch (cur_error.type) {
		case TOO_MANY_COLUMNS:
		case TOO_FEW_COLUMNS:
			if (result.current_line_position.begin == line_pos) {
				csv_error = CSVError::IncorrectColumnAmountError(
				    result.state_machine.options, col_idx, lines_per_batch, borked_line,
				    result.current_line_position.begin.GetGlobalPosition(result.requested_size, first_nl),
				    line_pos.GetGlobalPosition(result.requested_size, first_nl), result.path);
			} else {
				csv_error = CSVError::IncorrectColumnAmountError(
				    result.state_machine.options, col_idx, lines_per_batch, borked_line,
				    result.current_line_position.begin.GetGlobalPosition(result.requested_size, first_nl),
				    line_pos.GetGlobalPosition(result.requested_size), result.path);
			}
			break;
		case INVALID_UNICODE: {
			if (result.current_line_position.begin == line_pos) {
				csv_error = CSVError::InvalidUTF8(
				    result.state_machine.options, col_idx, lines_per_batch, borked_line,
				    result.current_line_position.begin.GetGlobalPosition(result.requested_size, first_nl),
				    line_pos.GetGlobalPosition(result.requested_size, first_nl), result.path);
			} else {
				csv_error = CSVError::InvalidUTF8(
				    result.state_machine.options, col_idx, lines_per_batch, borked_line,
				    result.current_line_position.begin.GetGlobalPosition(result.requested_size, first_nl),
				    line_pos.GetGlobalPosition(result.requested_size), result.path);
			}
			if (!StringValueScanner::CanDirectlyCast(result.csv_file_scan->file_types[col_idx], result.icu_loaded)) {
				result.number_of_rows--;
			}
			break;
		}
		case UNTERMINATED_QUOTES:
			if (result.current_line_position.begin == line_pos) {
				csv_error = CSVError::UnterminatedQuotesError(
				    result.state_machine.options, col_idx, lines_per_batch, borked_line,
				    result.current_line_position.begin.GetGlobalPosition(result.requested_size, first_nl),
				    line_pos.GetGlobalPosition(result.requested_size, first_nl), result.path);
			} else {
				csv_error = CSVError::UnterminatedQuotesError(
				    result.state_machine.options, col_idx, lines_per_batch, borked_line,
				    result.current_line_position.begin.GetGlobalPosition(result.requested_size, first_nl),
				    line_pos.GetGlobalPosition(result.requested_size), result.path);
			}
			break;
		case CAST_ERROR: {
			string column_name;
			LogicalTypeId type_id = LogicalTypeId::INVALID;
			if (cur_error.col_idx < result.names.size()) {
				column_name = result.names[cur_error.col_idx];
			}
			if (cur_error.col_idx < result.number_of_columns) {
				type_id = result.parse_types[cur_error.chunk_idx].type_id;
			}
			if (result.current_line_position.begin == line_pos) {
				csv_error = CSVError::CastError(
				    result.state_machine.options, column_name, cur_error.error_message, cur_error.col_idx, borked_line,
				    lines_per_batch,
				    result.current_line_position.begin.GetGlobalPosition(result.requested_size, first_nl),
				    line_pos.GetGlobalPosition(result.requested_size, first_nl), type_id, result.path);
			} else {
				csv_error = CSVError::CastError(
				    result.state_machine.options, column_name, cur_error.error_message, cur_error.col_idx, borked_line,
				    lines_per_batch,
				    result.current_line_position.begin.GetGlobalPosition(result.requested_size, first_nl),
				    line_pos.GetGlobalPosition(result.requested_size), type_id, result.path);
			}
		} break;
		case MAXIMUM_LINE_SIZE:
			csv_error = CSVError::LineSizeError(
			    result.state_machine.options, lines_per_batch, borked_line,
			    result.current_line_position.begin.GetGlobalPosition(result.requested_size, first_nl), result.path);
			break;
		case INVALID_STATE:
			if (result.current_line_position.begin == line_pos) {
				csv_error = CSVError::InvalidState(
				    result.state_machine.options, col_idx, lines_per_batch, borked_line,
				    result.current_line_position.begin.GetGlobalPosition(result.requested_size, first_nl),
				    line_pos.GetGlobalPosition(result.requested_size, first_nl), result.path);
			} else {
				csv_error = CSVError::InvalidState(
				    result.state_machine.options, col_idx, lines_per_batch, borked_line,
				    result.current_line_position.begin.GetGlobalPosition(result.requested_size, first_nl),
				    line_pos.GetGlobalPosition(result.requested_size), result.path);
			}
			break;
		default:
			throw InvalidInputException("CSV Error not allowed when inserting row");
		}
		result.error_handler.Error(csv_error);
	}
	if (is_error_in_line && scan_id != StringValueScanner::LINE_FINDER_ID) {
		if (result.sniffing) {
			// If we are sniffing we just remove the line
			result.RemoveLastLine();
		} else {
			// Otherwise, we add it to the borked rows to remove it later and just cleanup the column variables.
			result.borked_rows.insert(static_cast<idx_t>(result.number_of_rows));
			result.cur_col_id = 0;
			result.chunk_col_id = 0;
		}
		Reset();
		return true;
	}
	return false;
}